

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

NamedConditionalDirectiveExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NamedConditionalDirectiveExpressionSyntax,slang::syntax::NamedConditionalDirectiveExpressionSyntax_const&>
          (BumpAllocator *this,NamedConditionalDirectiveExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  NamedConditionalDirectiveExpressionSyntax *pNVar8;
  
  pNVar8 = (NamedConditionalDirectiveExpressionSyntax *)allocate(this,0x28,8);
  uVar3 = *(undefined4 *)
           &(args->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.previewNode;
  TVar4 = (args->name).kind;
  uVar5 = (args->name).field_0x2;
  NVar6.raw = (args->name).numFlags.raw;
  uVar7 = (args->name).rawLen;
  (pNVar8->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.kind =
       (args->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pNVar8->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.field_0x4 =
       uVar3;
  (pNVar8->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.parent = pSVar1;
  (pNVar8->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pNVar8->name).kind = TVar4;
  (pNVar8->name).field_0x2 = uVar5;
  (pNVar8->name).numFlags = (NumericTokenFlags)NVar6.raw;
  (pNVar8->name).rawLen = uVar7;
  (pNVar8->name).info = (args->name).info;
  return pNVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }